

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

void duckdb::RenderPhaseTimings
               (ostream *ss,
               pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
               *head,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     *timings,idx_t width)

{
  _Base_ptr p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  ::std::operator<<(ss,anon_var_dwarf_b69848);
  ::std::__cxx11::string::string((string *)&local_70,(string *)head);
  RenderTitleCase(&local_d0,&local_70);
  __lhs = &local_d0;
  ::std::operator+(&local_150,__lhs,": ");
  RenderTiming_abi_cxx11_(&local_130,(duckdb *)__lhs,head->second);
  ::std::operator+(&local_b0,&local_150,&local_130);
  QueryProfiler::DrawPadded(&local_110,&local_b0,width - 2);
  ::std::operator+(&local_90,anon_var_dwarf_b69890 + 3,&local_110);
  ::std::operator+(&local_f0,&local_90,anon_var_dwarf_b69914 + 0x2c);
  ::std::operator<<(ss,(string *)&local_f0);
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_110);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_130);
  ::std::__cxx11::string::~string((string *)&local_150);
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::operator<<(ss,anon_var_dwarf_b69884);
  for (p_Var1 = (timings->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(timings->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)::std::_Rb_tree_increment(p_Var1)) {
    ::std::__cxx11::string::string((string *)&local_50,(string *)(p_Var1 + 1));
    RenderTitleCase(&local_d0,&local_50);
    this = &local_d0;
    ::std::operator+(&local_150,&local_d0,": ");
    RenderTiming_abi_cxx11_(&local_130,(duckdb *)this,*(double *)(p_Var1 + 2));
    ::std::operator+(&local_b0,&local_150,&local_130);
    QueryProfiler::DrawPadded(&local_110,&local_b0,width - 4);
    ::std::operator+(&local_90,anon_var_dwarf_b69890,&local_110);
    ::std::operator+(&local_f0,&local_90,anon_var_dwarf_b69914 + 0x29);
    ::std::operator<<(ss,(string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_110);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_130);
    ::std::__cxx11::string::~string((string *)&local_150);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  ::std::operator<<(ss,anon_var_dwarf_b698a8);
  ::std::operator<<(ss,anon_var_dwarf_b698b4);
  return;
}

Assistant:

void RenderPhaseTimings(std::ostream &ss, const pair<string, double> &head, map<string, double> &timings, idx_t width) {
	ss << "┌────────────────────────────────────────────────┐\n";
	ss << "│" + QueryProfiler::DrawPadded(RenderTitleCase(head.first) + ": " + RenderTiming(head.second), width - 2) +
	          "│\n";
	ss << "│┌──────────────────────────────────────────────┐│\n";

	for (const auto &entry : timings) {
		ss << "││" +
		          QueryProfiler::DrawPadded(RenderTitleCase(entry.first) + ": " + RenderTiming(entry.second),
		                                    width - 4) +
		          "││\n";
	}
	ss << "│└──────────────────────────────────────────────┘│\n";
	ss << "└────────────────────────────────────────────────┘\n";
}